

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<wchar_t,std::allocator<wchar_t>>,void>
               (vector<wchar_t,_std::allocator<wchar_t>_> *container,ostream *os)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  long lVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pwVar2 = (container->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pwVar1 = (container->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pwVar2 != pwVar1) {
    lVar4 = 0;
    do {
      lVar3 = lVar4 + -1;
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar4 == -0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00326037;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      testing::internal::PrintTo(*pwVar2,os);
      pwVar2 = pwVar2 + 1;
      lVar4 = lVar3;
    } while (pwVar2 != pwVar1);
    if (lVar3 != 0) {
LAB_00326037:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }